

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg.cpp
# Opt level: O0

void duckdb::HugeintAverageOperation::Finalize<double,duckdb::AvgState<duckdb::hugeint_t>>
               (AvgState<duckdb::hugeint_t> *state,double *target,
               AggregateFinalizeData *finalize_data)

{
  hugeint_t input;
  long in_RDX;
  AggregateFinalizeData *in_RSI;
  long *in_RDI;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble divident;
  uint64_t in_stack_ffffffffffffffc8;
  optional_ptr<duckdb::FunctionData,_true> bind_data;
  
  if (*in_RDI == 0) {
    AggregateFinalizeData::ReturnNull(in_RSI);
  }
  else {
    bind_data.ptr = (FunctionData *)**(undefined8 **)(in_RDX + 8);
    GetAverageDivident<long_double>(in_stack_ffffffffffffffc8,bind_data);
    input.upper = (int64_t)bind_data.ptr;
    input.lower = in_stack_ffffffffffffffc8;
    Hugeint::Cast<long_double>(input);
    in_RSI->result = (Vector *)(double)(in_ST1 / in_ST0);
  }
  return;
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (state.count == 0) {
			finalize_data.ReturnNull();
		} else {
			long double divident = GetAverageDivident<long double>(state.count, finalize_data.input.bind_data);
			target = Hugeint::Cast<long double>(state.value) / divident;
		}
	}